

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::delaunizecavity
          (tetgenmesh *this,arraypool *cavpoints,arraypool *cavfaces,arraypool *cavshells,
          arraypool *newtets,arraypool *crosstets,arraypool *misfaces)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char **ppcVar5;
  point pdVar6;
  shellface ppdVar7;
  shellface ppdVar8;
  shellface ppdVar9;
  long lVar10;
  memorypool *pmVar11;
  undefined8 *puVar12;
  double dVar13;
  arraypool *paVar14;
  arraypool *this_00;
  int iVar15;
  tetgenbehavior *ptVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  double *pb;
  double *pb_00;
  uint uVar23;
  ulong uVar24;
  point pdVar25;
  ulong *puVar26;
  double *pd;
  int *piVar27;
  long lVar28;
  point unaff_R14;
  long lVar29;
  face tmpsh;
  insertvertexflags ivf;
  double *local_138;
  face local_120;
  triface local_110;
  arraypool *local_100;
  arraypool *local_f8;
  ulong local_f0;
  point local_e8 [4];
  long local_c8;
  long local_c0;
  insertvertexflags local_b8;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_100 = crosstets;
  local_f8 = newtets;
  local_110.tet = (tetrahedron *)0x0;
  local_110.ver = 0;
  local_120.sh = (shellface *)0x0;
  local_120.shver = 0;
  local_b8.refinetet.ver = 0;
  local_b8.refinesh.shver = 0;
  local_b8.refinetet.tet = (tetrahedron *)0x0;
  local_b8.refinesh.sh = (shellface *)0x0;
  local_b8.smlenflag = 0;
  local_b8.smlen = 0.0;
  local_b8.iloc = 0;
  local_b8.bowywat = 0;
  local_b8.lawson = 0;
  local_b8.splitbdflag = 0;
  local_b8.validflag = 0;
  local_b8.respectbdflag = 0;
  local_b8.rejflag = 0;
  local_b8.chkencflag = 0;
  local_b8.cdtflag = 0;
  local_b8.assignmeshsize = 0;
  local_b8.sloc = 0;
  local_b8.sbowywat = 0;
  local_b8.refineflag = 0;
  ptVar16 = this->b;
  iVar15 = ptVar16->verbose;
  if (2 < iVar15) {
    printf("      Delaunizing cavity: %ld points, %ld faces.\n",cavpoints->objects,cavfaces->objects
          );
    ptVar16 = this->b;
    iVar15 = ptVar16->verbose;
  }
  local_c8 = local_100->objects;
  local_c0 = this->hullsize;
  local_48._0_4_ = this->checksubsegflag;
  local_48._4_4_ = this->checksubfaceflag;
  uStack_40 = 0;
  pdVar25 = (double *)0x0;
  this->hullsize = 0;
  this->checksubsegflag = 0;
  this->checksubfaceflag = 0;
  ptVar16->verbose = iVar15 + -1;
  ptVar16->plc = 0;
  local_b8.bowywat = 1;
  uVar24 = cavfaces->objects;
  if ((long)uVar24 < 1) {
    uVar21 = 0;
    pb = (double *)0x0;
    local_138 = (double *)0x0;
  }
  else {
    ppcVar5 = cavfaces->toparray;
    iVar15 = cavfaces->log2objectsperblock;
    uVar2 = cavfaces->objectsperblockmark;
    iVar3 = cavfaces->objectbytes;
    pdVar6 = this->dummypoint;
    uVar21 = 0;
    do {
      pcVar18 = ppcVar5[(uint)uVar21 >> ((byte)iVar15 & 0x1f)];
      lVar29 = (long)(int)((uint)uVar21 & uVar2) * (long)iVar3;
      iVar4 = epivot[*(int *)(pcVar18 + lVar29 + 8)];
      *(int *)(pcVar18 + lVar29 + 8) = iVar4;
      unaff_R14 = *(point *)(pcVar18 + lVar29);
      pdVar25 = (point)unaff_R14[apexpivot[iVar4]];
      if (pdVar25 != pdVar6) {
        local_138 = (double *)unaff_R14[orgpivot[iVar4]];
        pb = (double *)unaff_R14[destpivot[iVar4]];
        goto LAB_0012e6cd;
      }
      uVar21 = uVar21 + 1;
    } while (uVar24 != uVar21);
    pdVar25 = (double *)0x0;
    local_138 = (double *)0x0;
    pb = (double *)0x0;
    uVar21 = uVar24;
  }
LAB_0012e6cd:
  uVar21 = uVar21 & 0xffffffff;
  if ((long)uVar21 < (long)uVar24) {
    do {
      local_f0 = uVar21;
      lVar22 = (long)cavfaces->objectbytes *
               (long)(int)(cavfaces->objectsperblockmark & (uint)uVar21);
      lVar29 = *(long *)(cavfaces->toparray
                         [(uint)uVar21 >> ((byte)cavfaces->log2objectsperblock & 0x1f)] + lVar22);
      iVar15 = *(int *)(cavfaces->toparray
                        [(uint)uVar21 >> ((byte)cavfaces->log2objectsperblock & 0x1f)] + lVar22 + 8)
      ;
      local_e8[0] = *(point *)(lVar29 + (long)orgpivot[iVar15] * 8);
      local_e8[1] = (point)*(undefined8 *)(lVar29 + (long)destpivot[iVar15] * 8);
      local_e8[2] = (point)*(undefined8 *)(lVar29 + (long)apexpivot[iVar15] * 8);
      lVar29 = 0;
      do {
        pd = local_e8[lVar29];
        if (pd != this->dummypoint) {
          dVar13 = orient3d(local_138,pb,pdVar25,pd);
          if ((dVar13 != 0.0) || (NAN(dVar13))) {
            pb_00 = pb;
            if (0.0 < dVar13) {
              local_e8[lVar29] = local_138;
              pb_00 = local_138;
              local_138 = pb;
            }
            pb = pb_00;
            unaff_R14 = local_e8[0];
            if (pd != (double *)0x0) goto LAB_0012e7c8;
            break;
          }
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 != 3);
      uVar21 = local_f0 + 1;
    } while ((long)uVar21 < cavfaces->objects);
    pd = (point)0x0;
    pb_00 = pb;
    unaff_R14 = local_e8[0];
  }
  else {
    pd = (point)0x0;
    pb_00 = pb;
  }
LAB_0012e7c8:
  initialdelaunay(this,local_138,pb_00,pdVar25,pd);
  if (0 < cavpoints->objects) {
    lVar29 = 0;
    do {
      unaff_R14 = *(point *)(cavpoints->toparray
                             [(uint)lVar29 >> ((byte)cavpoints->log2objectsperblock & 0x1f)] +
                            (long)cavpoints->objectbytes *
                            (long)(int)(cavpoints->objectsperblockmark & (uint)lVar29));
      local_110.tet = (this->recenttet).tet;
      local_110.ver = (this->recenttet).ver;
      local_b8.iloc = 1;
      insertpoint(this,unaff_R14,&local_110,(face *)0x0,(face *)0x0,&local_b8);
      lVar29 = lVar29 + 1;
    } while (lVar29 < cavpoints->objects);
  }
  local_e8[0] = unaff_R14;
  if (2 < this->b->verbose) {
    printf("      Identifying %ld boundary faces of the cavity.\n",cavfaces->objects);
  }
  while( true ) {
    if (0 < cavfaces->objects) {
      lVar29 = 0;
      do {
        lVar19 = (long)cavfaces->objectbytes *
                 (long)(int)(cavfaces->objectsperblockmark & (uint)lVar29);
        lVar22 = *(long *)(cavfaces->toparray
                           [(uint)lVar29 >> ((byte)cavfaces->log2objectsperblock & 0x1f)] + lVar19);
        if ((*(byte *)(lVar22 + (long)this->elemmarkerindex * 4) & 1) == 0) {
          puVar26 = (ulong *)(cavfaces->toparray
                              [(uint)lVar29 >> ((byte)cavfaces->log2objectsperblock & 0x1f)] +
                             lVar19);
          iVar15 = epivot[(int)puVar26[1]];
          *(int *)(puVar26 + 1) = iVar15;
          ppdVar7 = *(shellface *)(lVar22 + (long)orgpivot[iVar15] * 8);
          ppdVar8 = *(shellface *)(lVar22 + (long)destpivot[iVar15] * 8);
          ppdVar9 = *(shellface *)(lVar22 + (long)apexpivot[iVar15] * 8);
          makeshellface(this,this->subfaces,&local_120);
          lVar22 = (long)local_120.shver;
          local_120.sh[sorgpivot[lVar22]] = ppdVar7;
          local_120.sh[sdestpivot[lVar22]] = ppdVar8;
          local_120.sh[sapexpivot[lVar22]] = ppdVar9;
          local_110.tet = (tetrahedron *)0x0;
          iVar15 = scoutsubface(this,&local_120,&local_110,0);
          if (iVar15 == 0) {
            piVar27 = (int *)(puVar26 + 1);
            pmVar11 = this->subfaces;
            local_120.sh[3] = (shellface)0x0;
            *local_120.sh = (shellface)pmVar11->deaditemstack;
            pmVar11->deaditemstack = local_120.sh;
            pmVar11->items = pmVar11->items + -1;
            pcVar17 = arraypool::getblock(misfaces,(int)misfaces->objects);
            lVar22 = (long)misfaces->objectbytes *
                     ((long)misfaces->objectsperblock - 1U & misfaces->objects);
            pcVar18 = pcVar17 + lVar22;
            misfaces->objects = misfaces->objects + 1;
            *(ulong *)(pcVar17 + lVar22) = *puVar26;
          }
          else {
            *local_120.sh = (shellface)((long)(int)puVar26[1] | *puVar26);
            pcVar17 = arraypool::getblock(cavshells,(int)cavshells->objects);
            lVar22 = (long)cavshells->objectbytes *
                     ((long)cavshells->objectsperblock - 1U & cavshells->objects);
            pcVar18 = pcVar17 + lVar22;
            cavshells->objects = cavshells->objects + 1;
            *(shellface **)(pcVar17 + lVar22) = local_120.sh;
            piVar27 = &local_120.shver;
          }
          *(int *)(pcVar18 + 8) = *piVar27;
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 < cavfaces->objects);
    }
    paVar14 = local_f8;
    if (misfaces->objects < 1) break;
    if (2 < this->b->verbose) {
      printf("      Enlarging the cavity. %ld missing bdry faces\n");
    }
    lVar29 = cavshells->objects;
    if (0 < lVar29) {
      iVar15 = cavshells->log2objectsperblock;
      uVar2 = cavshells->objectsperblockmark;
      iVar3 = cavshells->objectbytes;
      lVar22 = 0;
      do {
        pcVar18 = cavshells->toparray[(uint)lVar22 >> ((byte)iVar15 & 0x1f)];
        lVar19 = (long)(int)((uint)lVar22 & uVar2) * (long)iVar3;
        uVar24 = *(ulong *)(*(long *)(pcVar18 + lVar19) + 0x48 +
                           (ulong)(*(uint *)(pcVar18 + lVar19 + 8) & 1) * 8);
        uVar23 = (uint)uVar24 & 0xf;
        uVar24 = uVar24 & 0xfffffffffffffff0;
        if (uVar24 != 0) {
          uVar23 = stpivottbl[uVar23][(int)*(uint *)(pcVar18 + lVar19 + 8)];
        }
        if (*(long *)(uVar24 + 0x48) != 0) {
          *(undefined8 *)(*(long *)(uVar24 + 0x48) + (ulong)(uVar23 & 3) * 8) = 0;
        }
        uVar24 = *(ulong *)(uVar24 + (ulong)(uVar23 & 3) * 8);
        lVar10 = *(long *)((uVar24 & 0xfffffffffffffff0) + 0x48);
        if (lVar10 != 0) {
          *(undefined8 *)(lVar10 + (ulong)(fsymtbl[(int)uVar23][(uint)uVar24 & 0xf] & 3) * 8) = 0;
        }
        pmVar11 = this->subfaces;
        puVar12 = *(undefined8 **)(pcVar18 + lVar19);
        puVar12[3] = 0;
        *puVar12 = pmVar11->deaditemstack;
        pmVar11->deaditemstack = puVar12;
        pmVar11->items = pmVar11->items + -1;
        lVar22 = lVar22 + 1;
      } while (lVar29 != lVar22);
    }
    cavshells->objects = 0;
    lVar29 = cavpoints->objects;
    if (0 < lVar29) {
      ppcVar5 = cavpoints->toparray;
      lVar22 = 0;
      do {
        puVar1 = (uint *)(*(long *)(ppcVar5[(uint)lVar22 >>
                                            ((byte)cavpoints->log2objectsperblock & 0x1f)] +
                                   (long)cavpoints->objectbytes *
                                   (long)(int)(cavpoints->objectsperblockmark & (uint)lVar22)) + 4 +
                         (long)this->pointmarkindex * 4);
        *puVar1 = *puVar1 | 1;
        lVar22 = lVar22 + 1;
      } while (lVar29 != lVar22);
    }
    lVar22 = misfaces->objects;
    if (0 < lVar22) {
      uVar24 = 0;
      do {
        paVar14 = local_100;
        pcVar18 = misfaces->toparray[(uint)uVar24 >> ((byte)misfaces->log2objectsperblock & 0x1f)];
        lVar29 = (long)misfaces->objectbytes *
                 (long)(int)(misfaces->objectsperblockmark & (uint)uVar24);
        uVar2 = *(uint *)(*(long *)(pcVar18 + lVar29) + (long)this->elemmarkerindex * 4);
        if ((uVar2 & 1) == 0) {
          *(uint *)(*(long *)(pcVar18 + lVar29) + (long)this->elemmarkerindex * 4) = uVar2 | 1;
          local_f0 = uVar24;
          pcVar17 = arraypool::getblock(local_100,(int)local_100->objects);
          lVar19 = (long)paVar14->objectbytes *
                   ((long)paVar14->objectsperblock - 1U & paVar14->objects);
          paVar14->objects = paVar14->objects + 1;
          lVar22 = *(long *)(pcVar18 + lVar29);
          *(long *)(pcVar17 + lVar19) = lVar22;
          uVar24 = (ulong)*(int *)(pcVar18 + lVar29 + 8);
          *(int *)(pcVar17 + lVar19 + 8) = *(int *)(pcVar18 + lVar29 + 8);
          pdVar25 = *(point *)(lVar22 + (long)oppopivot[uVar24] * 8);
          if ((*(byte *)((long)pdVar25 + (long)this->pointmarkindex * 4 + 4) & 1) == 0) {
            local_110.tet = (this->recenttet).tet;
            local_110.ver = (this->recenttet).ver;
            local_b8.iloc = 1;
            insertpoint(this,pdVar25,&local_110,(face *)0x0,(face *)0x0,&local_b8);
            puVar1 = (uint *)((long)pdVar25 + (long)this->pointmarkindex * 4 + 4);
            *puVar1 = *puVar1 | 1;
            pcVar17 = arraypool::getblock(cavpoints,(int)cavpoints->objects);
            uVar24 = cavpoints->objects;
            cavpoints->objects = uVar24 + 1;
            *(point *)(pcVar17 +
                      (long)cavpoints->objectbytes *
                      ((long)cavpoints->objectsperblock - 1U & uVar24)) = pdVar25;
            uVar24 = (ulong)*(uint *)(pcVar18 + lVar29 + 8);
          }
          iVar15 = 3;
          do {
            lVar22 = (long)(int)uVar24;
            uVar24 = *(ulong *)(*(long *)(pcVar18 + lVar29) + (ulong)(esymtbl[lVar22] & 3) * 8);
            uVar21 = uVar24 & 0xfffffffffffffff0;
            if ((*(byte *)(uVar21 + (long)this->elemmarkerindex * 4) & 1) == 0) {
              iVar3 = fsymtbl[esymtbl[lVar22]][(uint)uVar24 & 0xf];
              pcVar17 = arraypool::getblock(cavfaces,(int)cavfaces->objects);
              lVar22 = (long)cavfaces->objectbytes *
                       ((long)cavfaces->objectsperblock - 1U & cavfaces->objects);
              cavfaces->objects = cavfaces->objects + 1;
              *(ulong *)(pcVar17 + lVar22) = uVar21;
              *(int *)(pcVar17 + lVar22 + 8) = iVar3;
              lVar22 = (long)*(int *)(pcVar18 + lVar29 + 8);
            }
            uVar24 = (ulong)(uint)enexttbl[lVar22];
            *(int *)(pcVar18 + lVar29 + 8) = enexttbl[lVar22];
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
          lVar22 = misfaces->objects;
          uVar24 = local_f0;
        }
        uVar24 = uVar24 + 1;
      } while ((long)uVar24 < lVar22);
      lVar29 = cavpoints->objects;
    }
    if (0 < lVar29) {
      ppcVar5 = cavpoints->toparray;
      lVar22 = 0;
      do {
        puVar1 = (uint *)(*(long *)(ppcVar5[(uint)lVar22 >>
                                            ((byte)cavpoints->log2objectsperblock & 0x1f)] +
                                   (long)cavpoints->objectbytes *
                                   (long)(int)(cavpoints->objectsperblockmark & (uint)lVar22)) + 4 +
                         (long)this->pointmarkindex * 4);
        *puVar1 = *puVar1 & 0xfffffffe;
        lVar22 = lVar22 + 1;
      } while (lVar29 != lVar22);
    }
    misfaces->objects = 0;
  }
  puVar1 = (uint *)((long)(this->recenttet).tet + (long)this->elemmarkerindex * 4);
  *puVar1 = *puVar1 | 2;
  pcVar18 = arraypool::getblock(local_f8,(int)local_f8->objects);
  this_00 = local_f8;
  uVar24 = paVar14->objects;
  lVar22 = (long)paVar14->objectbytes;
  lVar19 = ((long)paVar14->objectsperblock - 1U & uVar24) * lVar22;
  lVar29 = uVar24 + 1;
  paVar14->objects = lVar29;
  *(tetrahedron **)(pcVar18 + lVar19) = (this->recenttet).tet;
  *(int *)(pcVar18 + lVar19 + 8) = (this->recenttet).ver;
  if (-1 < (long)uVar24) {
    lVar19 = 0;
    do {
      lVar10 = *(long *)(local_f8->toparray
                         [(uint)lVar19 >> ((byte)local_f8->log2objectsperblock & 0x1f)] +
                        (int)((local_f8->objectsperblockmark & (uint)lVar19) * (int)lVar22));
      lVar28 = 0;
      do {
        uVar24 = *(ulong *)(lVar10 + lVar28 * 8);
        uVar21 = uVar24 & 0xfffffffffffffff0;
        uVar2 = *(uint *)(uVar21 + (long)this->elemmarkerindex * 4);
        if ((uVar2 & 2) == 0) {
          *(uint *)(uVar21 + (long)this->elemmarkerindex * 4) = uVar2 | 2;
          pcVar18 = arraypool::getblock(this_00,(int)lVar29);
          lVar22 = (long)this_00->objectbytes;
          lVar20 = ((long)this_00->objectsperblock - 1U & this_00->objects) * lVar22;
          lVar29 = this_00->objects + 1;
          this_00->objects = lVar29;
          *(ulong *)(pcVar18 + lVar20) = uVar21;
          *(uint *)(pcVar18 + lVar20 + 8) = (uint)uVar24 & 0xf;
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != 4);
      lVar19 = lVar19 + 1;
    } while (lVar19 < lVar29);
  }
  cavpoints->objects = 0;
  cavfaces->objects = 0;
  if (local_c8 < local_100->objects) {
    this->cavityexpcount = this->cavityexpcount + 1;
  }
  this->hullsize = local_c0;
  this->checksubsegflag = (undefined4)local_48;
  this->checksubfaceflag = local_48._4_4_;
  ptVar16 = this->b;
  piVar27 = &ptVar16->verbose;
  *piVar27 = *piVar27 + 1;
  ptVar16->plc = 1;
  return;
}

Assistant:

void tetgenmesh::delaunizecavity(arraypool *cavpoints, arraypool *cavfaces, 
                                 arraypool *cavshells, arraypool *newtets, 
                                 arraypool *crosstets, arraypool *misfaces)
{
  triface searchtet, neightet, *parytet, *parytet1;
  face tmpsh, *parysh;
  point pa, pb, pc, pd, pt[3], *parypt;
  insertvertexflags ivf;
  REAL ori;
  long baknum, bakhullsize;
  int bakchecksubsegflag, bakchecksubfaceflag;
  int t1ver; 
  int i, j;

  if (b->verbose > 2) {
    printf("      Delaunizing cavity: %ld points, %ld faces.\n", 
           cavpoints->objects, cavfaces->objects);
  }
  // Remember the current number of crossing tets. It may be enlarged later.
  baknum = crosstets->objects;
  bakhullsize = hullsize;
  bakchecksubsegflag = checksubsegflag;
  bakchecksubfaceflag = checksubfaceflag;
  hullsize = 0l;
  checksubsegflag = 0;
  checksubfaceflag = 0;
  b->verbose--;  // Suppress informations for creating Delaunay tetra.
  b->plc = 0; // Do not check near vertices.

  ivf.bowywat = 1; // Use Bowyer-Watson algorithm.

  // Get four non-coplanar points (no dummypoint).
  pa = pb = pc = NULL;
  for (i = 0; i < cavfaces->objects; i++) {
    parytet = (triface *) fastlookup(cavfaces, i);
    parytet->ver = epivot[parytet->ver];
    if (apex(*parytet) != dummypoint) {
      pa = org(*parytet);
      pb = dest(*parytet);
      pc = apex(*parytet);
      break;
    }
  }
  pd = NULL;
  for (; i < cavfaces->objects; i++) {
    parytet = (triface *) fastlookup(cavfaces, i);
    pt[0] = org(*parytet);
    pt[1] = dest(*parytet);
    pt[2] = apex(*parytet);
    for (j = 0; j < 3; j++) {
      if (pt[j] != dummypoint) { // Do not include a hull point.
        ori = orient3d(pa, pb, pc, pt[j]);
        if (ori != 0) {
          pd = pt[j];
          if (ori > 0) {  // Swap pa and pb.
            pt[j] = pa; pa = pb; pb = pt[j]; 
          }
          break;
        }
      }
    }
    if (pd != NULL) break;
  }

  // Create an init DT.
  initialdelaunay(pa, pb, pc, pd);

  // Incrementally insert the vertices (duplicated vertices are ignored).
  for (i = 0; i < cavpoints->objects; i++) {
    pt[0] = * (point *) fastlookup(cavpoints, i);
    searchtet = recenttet;
    ivf.iloc = (int) OUTSIDE;
    insertpoint(pt[0], &searchtet, NULL, NULL, &ivf);
  }

  if (b->verbose > 2) {
    printf("      Identifying %ld boundary faces of the cavity.\n", 
           cavfaces->objects);
  }

  while (1) {

    // Identify boundary faces. Mark interior tets. Save missing faces.
    for (i = 0; i < cavfaces->objects; i++) {
      parytet = (triface *) fastlookup(cavfaces, i);
      // Skip an interior face (due to the enlargement of the cavity).
      if (infected(*parytet)) continue;
      parytet->ver = epivot[parytet->ver];
      pt[0] = org(*parytet);
      pt[1] = dest(*parytet);
      pt[2] = apex(*parytet);
      // Create a temp subface.
      makeshellface(subfaces, &tmpsh);
      setshvertices(tmpsh, pt[0], pt[1], pt[2]);
      // Insert tmpsh in DT.
      searchtet.tet = NULL; 
      if (scoutsubface(&tmpsh, &searchtet, 0)) { // shflag = 0
        // Inserted! 'tmpsh' must face toward the inside of the cavity.
        // Remember the boundary tet (outside the cavity) in tmpsh 
        //   (use the adjacent tet slot). 
        tmpsh.sh[0] = (shellface) encode(*parytet);
        // Save this subface.
        cavshells->newindex((void **) &parysh);
        *parysh = tmpsh;
      } 
      else {
        // This boundary face is missing.
        shellfacedealloc(subfaces, tmpsh.sh);
        // Save this face in list.
        misfaces->newindex((void **) &parytet1);
        *parytet1 = *parytet;
      }
    } // i

    if (misfaces->objects > 0) {
      if (b->verbose > 2) {
        printf("      Enlarging the cavity. %ld missing bdry faces\n", 
               misfaces->objects);
      }

      // Removing all temporary subfaces.
      for (i = 0; i < cavshells->objects; i++) {
        parysh = (face *) fastlookup(cavshells, i);
        stpivot(*parysh, neightet);
        tsdissolve(neightet); // Detach it from adj. tets.
        fsymself(neightet);
        tsdissolve(neightet);
        shellfacedealloc(subfaces, parysh->sh);
      }
      cavshells->restart();

      // Infect the points which are of the cavity.
      for (i = 0; i < cavpoints->objects; i++) {
        pt[0] = * (point *) fastlookup(cavpoints, i);
        pinfect(pt[0]); // Mark it as inserted.
      }

      // Enlarge the cavity.
      for (i = 0; i < misfaces->objects; i++) {
        // Get a missing face.
        parytet = (triface *) fastlookup(misfaces, i);
        if (!infected(*parytet)) {
          // Put it into crossing tet list.
          infect(*parytet);
          crosstets->newindex((void **) &parytet1);
          *parytet1 = *parytet;
          // Insert the opposite point if it is not in DT.
          pd = oppo(*parytet);
          if (!pinfected(pd)) {
            searchtet = recenttet;
            ivf.iloc = (int) OUTSIDE;
            insertpoint(pd, &searchtet, NULL, NULL, &ivf);
            pinfect(pd);
            cavpoints->newindex((void **) &parypt);
            *parypt = pd;
          }
          // Add three opposite faces into the boundary list.
          for (j = 0; j < 3; j++) {
            esym(*parytet, neightet);
            fsymself(neightet);
            if (!infected(neightet)) {
              cavfaces->newindex((void **) &parytet1);
              *parytet1 = neightet;
            } 
            enextself(*parytet);
          } // j
        } // if (!infected(parytet))
      } // i

      // Uninfect the points which are of the cavity.
      for (i = 0; i < cavpoints->objects; i++) {
        pt[0] = * (point *) fastlookup(cavpoints, i);
        puninfect(pt[0]);
      }

      misfaces->restart();
      continue;
    } // if (misfaces->objects > 0)

    break;

  } // while (1)

  // Collect all tets of the DT. All new tets are marktested.
  marktest(recenttet);
  newtets->newindex((void **) &parytet);
  *parytet = recenttet;
  for (i = 0; i < newtets->objects; i++) {
    searchtet = * (triface *) fastlookup(newtets, i);
    for (j = 0; j < 4; j++) {
      decode(searchtet.tet[j], neightet);
      if (!marktested(neightet)) {
        marktest(neightet);
        newtets->newindex((void **) &parytet);
        *parytet = neightet;
      }
    }
  }

  cavpoints->restart();
  cavfaces->restart();

  if (crosstets->objects > baknum) {
    // The cavity has been enlarged.
    cavityexpcount++;
  }

  // Restore the original values.
  hullsize = bakhullsize;
  checksubsegflag = bakchecksubsegflag;
  checksubfaceflag = bakchecksubfaceflag;
  b->verbose++;
  b->plc = 1;
}